

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O1

void CVmObjList::add_to_list(vm_val_t *result,vm_obj_id_t self,char *lstval,vm_val_t *rhs)

{
  ushort uVar1;
  CVmObjPageEntry *pCVar2;
  ushort *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  anon_union_8_8_cb74652f_for_val aVar25;
  vm_datatype_t *pvVar26;
  undefined4 uVar27;
  vm_val_t *pvVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  uint uVar37;
  uint uVar38;
  vm_obj_id_t vVar39;
  uint uVar40;
  ulong uVar41;
  undefined1 *puVar42;
  long lVar43;
  ulong uVar45;
  ulong uVar46;
  undefined1 auVar47 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar69;
  int iVar70;
  undefined1 auVar67 [16];
  int iVar71;
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  int iVar89;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  vm_val_t val;
  uint local_58;
  vm_val_t local_50;
  vm_val_t local_40;
  ulong uVar44;
  
  pvVar28 = sp_;
  pvVar26 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar26 = VM_OBJ;
  (pvVar28->val).obj = self;
  pvVar28 = sp_;
  uVar27 = *(undefined4 *)&rhs->field_0x4;
  aVar25 = rhs->val;
  sp_ = sp_ + 1;
  pvVar28->typ = rhs->typ;
  *(undefined4 *)&pvVar28->field_0x4 = uVar27;
  pvVar28->val = aVar25;
  uVar1 = *(ushort *)lstval;
  uVar45 = (ulong)uVar1;
  iVar36 = vm_val_t::is_listlike(rhs);
  if (iVar36 == 0) {
    uVar37 = 0xffffffff;
  }
  else {
    uVar37 = vm_val_t::ll_length(rhs);
  }
  uVar38 = 1;
  if (-1 < (int)uVar37) {
    uVar38 = uVar37;
  }
  vVar39 = create(0,(long)(int)uVar38 + uVar45 & 0xffffffff);
  pCVar2 = G_obj_table_X.pages_[vVar39 >> 0xc];
  uVar40 = vVar39 & 0xfff;
  memcpy((void *)(*(long *)((long)&pCVar2[uVar40].ptr_ + 8) + 2),lstval + 2,
         (ulong)*(ushort *)lstval * 5);
  auVar35 = _DAT_002ca730;
  auVar34 = _DAT_002ca720;
  auVar33 = _DAT_002ca710;
  auVar32 = _DAT_002ca700;
  auVar31 = _DAT_00299d30;
  auVar30 = _DAT_00299d20;
  auVar29 = _DAT_00299670;
  puVar3 = *(ushort **)((long)&pCVar2[uVar40].ptr_ + 8);
  if ((int)uVar37 < 0) {
    vmb_put_dh((char *)((long)puVar3 + uVar45 * 5 + 2),rhs);
  }
  else {
    uVar41 = (ulong)*puVar3;
    if (uVar41 != 0) {
      uVar46 = ((long)(int)uVar38 + uVar45) - 1;
      uVar44 = uVar41 - 1;
      if (uVar46 < uVar41) {
        uVar44 = uVar46;
      }
      lVar43 = uVar44 - uVar45;
      if (uVar45 <= uVar44) {
        auVar47._8_4_ = (int)lVar43;
        auVar47._0_8_ = lVar43;
        auVar47._12_4_ = (int)((ulong)lVar43 >> 0x20);
        puVar42 = (undefined1 *)((long)puVar3 + uVar45 * 5 + 0x4d);
        uVar45 = 0;
        do {
          auVar65._8_4_ = (int)uVar45;
          auVar65._0_8_ = uVar45;
          auVar65._12_4_ = (int)(uVar45 >> 0x20);
          auVar67 = auVar47 ^ auVar31;
          auVar72 = (auVar65 | auVar29) ^ auVar31;
          iVar36 = auVar67._0_4_;
          iVar85 = -(uint)(iVar36 < auVar72._0_4_);
          iVar69 = auVar67._4_4_;
          auVar74._4_4_ = -(uint)(iVar69 < auVar72._4_4_);
          iVar70 = auVar67._8_4_;
          iVar89 = -(uint)(iVar70 < auVar72._8_4_);
          iVar71 = auVar67._12_4_;
          auVar74._12_4_ = -(uint)(iVar71 < auVar72._12_4_);
          auVar48._4_4_ = iVar85;
          auVar48._0_4_ = iVar85;
          auVar48._8_4_ = iVar89;
          auVar48._12_4_ = iVar89;
          auVar48 = pshuflw(in_XMM1,auVar48,0xe8);
          auVar73._4_4_ = -(uint)(auVar72._4_4_ == iVar69);
          auVar73._12_4_ = -(uint)(auVar72._12_4_ == iVar71);
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar57 = pshuflw(in_XMM2,auVar73,0xe8);
          auVar74._0_4_ = auVar74._4_4_;
          auVar74._8_4_ = auVar74._12_4_;
          auVar72 = pshuflw(auVar48,auVar74,0xe8);
          auVar67._8_4_ = 0xffffffff;
          auVar67._0_8_ = 0xffffffffffffffff;
          auVar67._12_4_ = 0xffffffff;
          auVar67 = (auVar72 | auVar57 & auVar48) ^ auVar67;
          auVar67 = packssdw(auVar67,auVar67);
          if ((auVar67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar42[-0x4b] = 1;
          }
          auVar57._4_4_ = iVar85;
          auVar57._0_4_ = iVar85;
          auVar57._8_4_ = iVar89;
          auVar57._12_4_ = iVar89;
          auVar74 = auVar73 & auVar57 | auVar74;
          auVar67 = packssdw(auVar74,auVar74);
          auVar72._8_4_ = 0xffffffff;
          auVar72._0_8_ = 0xffffffffffffffff;
          auVar72._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar72,auVar67 ^ auVar72);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._0_4_ >> 8 & 1) != 0) {
            puVar42[-0x46] = 1;
          }
          auVar67 = (auVar65 | auVar30) ^ auVar31;
          auVar58._0_4_ = -(uint)(iVar36 < auVar67._0_4_);
          auVar58._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar58._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar58._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar75._4_4_ = auVar58._0_4_;
          auVar75._0_4_ = auVar58._0_4_;
          auVar75._8_4_ = auVar58._8_4_;
          auVar75._12_4_ = auVar58._8_4_;
          iVar85 = -(uint)(auVar67._4_4_ == iVar69);
          iVar89 = -(uint)(auVar67._12_4_ == iVar71);
          auVar13._4_4_ = iVar85;
          auVar13._0_4_ = iVar85;
          auVar13._8_4_ = iVar89;
          auVar13._12_4_ = iVar89;
          auVar86._4_4_ = auVar58._4_4_;
          auVar86._0_4_ = auVar58._4_4_;
          auVar86._8_4_ = auVar58._12_4_;
          auVar86._12_4_ = auVar58._12_4_;
          auVar67 = auVar13 & auVar75 | auVar86;
          auVar67 = packssdw(auVar67,auVar67);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar4,auVar67 ^ auVar4);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._0_4_ >> 0x10 & 1) != 0) {
            puVar42[-0x41] = 1;
          }
          auVar67 = pshufhw(auVar67,auVar75,0x84);
          auVar14._4_4_ = iVar85;
          auVar14._0_4_ = iVar85;
          auVar14._8_4_ = iVar89;
          auVar14._12_4_ = iVar89;
          auVar72 = pshufhw(auVar58,auVar14,0x84);
          auVar48 = pshufhw(auVar67,auVar86,0x84);
          auVar49._8_4_ = 0xffffffff;
          auVar49._0_8_ = 0xffffffffffffffff;
          auVar49._12_4_ = 0xffffffff;
          auVar49 = (auVar48 | auVar72 & auVar67) ^ auVar49;
          auVar67 = packssdw(auVar49,auVar49);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._0_4_ >> 0x18 & 1) != 0) {
            puVar42[-0x3c] = 1;
          }
          auVar67 = (auVar65 | auVar35) ^ auVar31;
          auVar59._0_4_ = -(uint)(iVar36 < auVar67._0_4_);
          auVar59._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar59._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar59._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar15._4_4_ = auVar59._0_4_;
          auVar15._0_4_ = auVar59._0_4_;
          auVar15._8_4_ = auVar59._8_4_;
          auVar15._12_4_ = auVar59._8_4_;
          auVar72 = pshuflw(auVar86,auVar15,0xe8);
          auVar50._0_4_ = -(uint)(auVar67._0_4_ == iVar36);
          auVar50._4_4_ = -(uint)(auVar67._4_4_ == iVar69);
          auVar50._8_4_ = -(uint)(auVar67._8_4_ == iVar70);
          auVar50._12_4_ = -(uint)(auVar67._12_4_ == iVar71);
          auVar76._4_4_ = auVar50._4_4_;
          auVar76._0_4_ = auVar50._4_4_;
          auVar76._8_4_ = auVar50._12_4_;
          auVar76._12_4_ = auVar50._12_4_;
          auVar67 = pshuflw(auVar50,auVar76,0xe8);
          auVar77._4_4_ = auVar59._4_4_;
          auVar77._0_4_ = auVar59._4_4_;
          auVar77._8_4_ = auVar59._12_4_;
          auVar77._12_4_ = auVar59._12_4_;
          auVar48 = pshuflw(auVar59,auVar77,0xe8);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 & auVar72,(auVar48 | auVar67 & auVar72) ^ auVar5);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar42[-0x37] = 1;
          }
          auVar16._4_4_ = auVar59._0_4_;
          auVar16._0_4_ = auVar59._0_4_;
          auVar16._8_4_ = auVar59._8_4_;
          auVar16._12_4_ = auVar59._8_4_;
          auVar77 = auVar76 & auVar16 | auVar77;
          auVar48 = packssdw(auVar77,auVar77);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67,auVar48 ^ auVar6);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._4_2_ >> 8 & 1) != 0) {
            puVar42[-0x32] = 1;
          }
          auVar67 = (auVar65 | auVar34) ^ auVar31;
          auVar60._0_4_ = -(uint)(iVar36 < auVar67._0_4_);
          auVar60._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar60._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar60._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar78._4_4_ = auVar60._0_4_;
          auVar78._0_4_ = auVar60._0_4_;
          auVar78._8_4_ = auVar60._8_4_;
          auVar78._12_4_ = auVar60._8_4_;
          iVar85 = -(uint)(auVar67._4_4_ == iVar69);
          iVar89 = -(uint)(auVar67._12_4_ == iVar71);
          auVar17._4_4_ = iVar85;
          auVar17._0_4_ = iVar85;
          auVar17._8_4_ = iVar89;
          auVar17._12_4_ = iVar89;
          auVar87._4_4_ = auVar60._4_4_;
          auVar87._0_4_ = auVar60._4_4_;
          auVar87._8_4_ = auVar60._12_4_;
          auVar87._12_4_ = auVar60._12_4_;
          auVar67 = auVar17 & auVar78 | auVar87;
          auVar67 = packssdw(auVar67,auVar67);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar7,auVar67 ^ auVar7);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar42[-0x2d] = 1;
          }
          auVar67 = pshufhw(auVar67,auVar78,0x84);
          auVar18._4_4_ = iVar85;
          auVar18._0_4_ = iVar85;
          auVar18._8_4_ = iVar89;
          auVar18._12_4_ = iVar89;
          auVar72 = pshufhw(auVar60,auVar18,0x84);
          auVar48 = pshufhw(auVar67,auVar87,0x84);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar51 = (auVar48 | auVar72 & auVar67) ^ auVar51;
          auVar67 = packssdw(auVar51,auVar51);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._6_2_ >> 8 & 1) != 0) {
            puVar42[-0x28] = 1;
          }
          auVar67 = (auVar65 | auVar33) ^ auVar31;
          auVar61._0_4_ = -(uint)(iVar36 < auVar67._0_4_);
          auVar61._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar61._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar61._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar19._4_4_ = auVar61._0_4_;
          auVar19._0_4_ = auVar61._0_4_;
          auVar19._8_4_ = auVar61._8_4_;
          auVar19._12_4_ = auVar61._8_4_;
          auVar72 = pshuflw(auVar87,auVar19,0xe8);
          auVar52._0_4_ = -(uint)(auVar67._0_4_ == iVar36);
          auVar52._4_4_ = -(uint)(auVar67._4_4_ == iVar69);
          auVar52._8_4_ = -(uint)(auVar67._8_4_ == iVar70);
          auVar52._12_4_ = -(uint)(auVar67._12_4_ == iVar71);
          auVar79._4_4_ = auVar52._4_4_;
          auVar79._0_4_ = auVar52._4_4_;
          auVar79._8_4_ = auVar52._12_4_;
          auVar79._12_4_ = auVar52._12_4_;
          auVar67 = pshuflw(auVar52,auVar79,0xe8);
          auVar80._4_4_ = auVar61._4_4_;
          auVar80._0_4_ = auVar61._4_4_;
          auVar80._8_4_ = auVar61._12_4_;
          auVar80._12_4_ = auVar61._12_4_;
          auVar48 = pshuflw(auVar61,auVar80,0xe8);
          auVar62._8_4_ = 0xffffffff;
          auVar62._0_8_ = 0xffffffffffffffff;
          auVar62._12_4_ = 0xffffffff;
          auVar62 = (auVar48 | auVar67 & auVar72) ^ auVar62;
          auVar48 = packssdw(auVar62,auVar62);
          auVar67 = packsswb(auVar67 & auVar72,auVar48);
          if ((auVar67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar42[-0x23] = 1;
          }
          auVar20._4_4_ = auVar61._0_4_;
          auVar20._0_4_ = auVar61._0_4_;
          auVar20._8_4_ = auVar61._8_4_;
          auVar20._12_4_ = auVar61._8_4_;
          auVar80 = auVar79 & auVar20 | auVar80;
          auVar48 = packssdw(auVar80,auVar80);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar48 = packssdw(auVar48 ^ auVar8,auVar48 ^ auVar8);
          auVar67 = packsswb(auVar67,auVar48);
          if ((auVar67._8_2_ >> 8 & 1) != 0) {
            puVar42[-0x1e] = 1;
          }
          auVar67 = (auVar65 | auVar32) ^ auVar31;
          auVar63._0_4_ = -(uint)(iVar36 < auVar67._0_4_);
          auVar63._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar63._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar63._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar81._4_4_ = auVar63._0_4_;
          auVar81._0_4_ = auVar63._0_4_;
          auVar81._8_4_ = auVar63._8_4_;
          auVar81._12_4_ = auVar63._8_4_;
          iVar85 = -(uint)(auVar67._4_4_ == iVar69);
          iVar89 = -(uint)(auVar67._12_4_ == iVar71);
          auVar21._4_4_ = iVar85;
          auVar21._0_4_ = iVar85;
          auVar21._8_4_ = iVar89;
          auVar21._12_4_ = iVar89;
          auVar88._4_4_ = auVar63._4_4_;
          auVar88._0_4_ = auVar63._4_4_;
          auVar88._8_4_ = auVar63._12_4_;
          auVar88._12_4_ = auVar63._12_4_;
          auVar67 = auVar21 & auVar81 | auVar88;
          auVar67 = packssdw(auVar67,auVar67);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar9,auVar67 ^ auVar9);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar42[-0x19] = 1;
          }
          auVar67 = pshufhw(auVar67,auVar81,0x84);
          auVar22._4_4_ = iVar85;
          auVar22._0_4_ = iVar85;
          auVar22._8_4_ = iVar89;
          auVar22._12_4_ = iVar89;
          auVar72 = pshufhw(auVar63,auVar22,0x84);
          auVar48 = pshufhw(auVar67,auVar88,0x84);
          auVar53._8_4_ = 0xffffffff;
          auVar53._0_8_ = 0xffffffffffffffff;
          auVar53._12_4_ = 0xffffffff;
          auVar53 = (auVar48 | auVar72 & auVar67) ^ auVar53;
          auVar67 = packssdw(auVar53,auVar53);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._10_2_ >> 8 & 1) != 0) {
            puVar42[-0x14] = 1;
          }
          auVar67 = (auVar65 | _DAT_002ca6f0) ^ auVar31;
          auVar64._0_4_ = -(uint)(iVar36 < auVar67._0_4_);
          auVar64._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar64._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar64._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar23._4_4_ = auVar64._0_4_;
          auVar23._0_4_ = auVar64._0_4_;
          auVar23._8_4_ = auVar64._8_4_;
          auVar23._12_4_ = auVar64._8_4_;
          auVar72 = pshuflw(auVar88,auVar23,0xe8);
          auVar54._0_4_ = -(uint)(auVar67._0_4_ == iVar36);
          auVar54._4_4_ = -(uint)(auVar67._4_4_ == iVar69);
          auVar54._8_4_ = -(uint)(auVar67._8_4_ == iVar70);
          auVar54._12_4_ = -(uint)(auVar67._12_4_ == iVar71);
          auVar82._4_4_ = auVar54._4_4_;
          auVar82._0_4_ = auVar54._4_4_;
          auVar82._8_4_ = auVar54._12_4_;
          auVar82._12_4_ = auVar54._12_4_;
          auVar67 = pshuflw(auVar54,auVar82,0xe8);
          auVar83._4_4_ = auVar64._4_4_;
          auVar83._0_4_ = auVar64._4_4_;
          auVar83._8_4_ = auVar64._12_4_;
          auVar83._12_4_ = auVar64._12_4_;
          auVar48 = pshuflw(auVar64,auVar83,0xe8);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 & auVar72,(auVar48 | auVar67 & auVar72) ^ auVar10);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar42[-0xf] = 1;
          }
          auVar24._4_4_ = auVar64._0_4_;
          auVar24._0_4_ = auVar64._0_4_;
          auVar24._8_4_ = auVar64._8_4_;
          auVar24._12_4_ = auVar64._8_4_;
          auVar83 = auVar82 & auVar24 | auVar83;
          auVar48 = packssdw(auVar83,auVar83);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67,auVar48 ^ auVar11);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._12_2_ >> 8 & 1) != 0) {
            puVar42[-10] = 1;
          }
          auVar67 = (auVar65 | _DAT_002ca6e0) ^ auVar31;
          auVar55._0_4_ = -(uint)(iVar36 < auVar67._0_4_);
          auVar55._4_4_ = -(uint)(iVar69 < auVar67._4_4_);
          auVar55._8_4_ = -(uint)(iVar70 < auVar67._8_4_);
          auVar55._12_4_ = -(uint)(iVar71 < auVar67._12_4_);
          auVar84._4_4_ = auVar55._0_4_;
          auVar84._0_4_ = auVar55._0_4_;
          auVar84._8_4_ = auVar55._8_4_;
          auVar84._12_4_ = auVar55._8_4_;
          auVar66._4_4_ = -(uint)(auVar67._4_4_ == iVar69);
          auVar66._12_4_ = -(uint)(auVar67._12_4_ == iVar71);
          auVar66._0_4_ = auVar66._4_4_;
          auVar66._8_4_ = auVar66._12_4_;
          auVar68._4_4_ = auVar55._4_4_;
          auVar68._0_4_ = auVar55._4_4_;
          auVar68._8_4_ = auVar55._12_4_;
          auVar68._12_4_ = auVar55._12_4_;
          auVar48 = auVar66 & auVar84 | auVar68;
          auVar67 = packssdw(auVar55,auVar48);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar67 = packssdw(auVar67 ^ auVar12,auVar67 ^ auVar12);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar42[-5] = 1;
          }
          auVar67 = pshufhw(auVar67,auVar84,0x84);
          in_XMM2 = pshufhw(auVar48,auVar66,0x84);
          in_XMM2 = in_XMM2 & auVar67;
          auVar67 = pshufhw(auVar67,auVar68,0x84);
          auVar56._8_4_ = 0xffffffff;
          auVar56._0_8_ = 0xffffffffffffffff;
          auVar56._12_4_ = 0xffffffff;
          auVar56 = (auVar67 | in_XMM2) ^ auVar56;
          auVar67 = packssdw(auVar56,auVar56);
          in_XMM1 = packsswb(auVar67,auVar67);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            *puVar42 = 1;
          }
          uVar45 = uVar45 + 0x10;
          puVar42 = puVar42 + 0x50;
        } while ((lVar43 + 0x10U & 0xfffffffffffffff0) != uVar45);
      }
    }
    if (uVar37 != 0) {
      uVar45 = 1;
      if (1 < (int)uVar37) {
        uVar45 = (ulong)uVar37;
      }
      uVar41 = 0;
      do {
        local_50.typ = VM_INT;
        uVar44 = uVar41 + 1;
        local_50.val.obj = (vm_obj_id_t)uVar44;
        vm_val_t::ll_index(rhs,&local_40,&local_50);
        local_58 = (uint)uVar1;
        vmb_put_dh((char *)(*(long *)((long)&pCVar2[uVar40].ptr_ + 8) +
                            (long)(int)((int)uVar41 + local_58) * 5 + 2),&local_40);
        uVar41 = uVar44;
      } while (uVar45 != uVar44);
    }
  }
  result->typ = VM_OBJ;
  (result->val).obj = vVar39;
  sp_ = sp_ + -2;
  return;
}

Assistant:

void CVmObjList::add_to_list(VMG_ vm_val_t *result,
                             vm_obj_id_t self, const char *lstval,
                             const vm_val_t *rhs)
{
    int lhs_cnt, rhs_cnt, alo_cnt;
    vm_obj_id_t obj;
    CVmObjList *objptr;

    /* push self and the other list for protection against GC */
    G_stk->push()->set_obj(self);
    G_stk->push(rhs);

    /* get the number of elements in the left-hand ('self') side */
    lhs_cnt = vmb_get_len(lstval);

    /* get the number of elements the right-hand side concatenates */
    rhs_cnt = (rhs->is_listlike(vmg0_) ? rhs->ll_length(vmg0_) : -1);

    /* if it's not a list, allocate on element */
    alo_cnt = (rhs_cnt < 0 ? 1 : rhs_cnt);

    /* allocate a new object to hold the new list */
    obj = create(vmg_ FALSE, lhs_cnt + alo_cnt);
    objptr = (CVmObjList *)vm_objp(vmg_ obj);

    /* copy the first list into the new object's list buffer */
    objptr->cons_copy_elements(0, lstval);

    /* add the value or its contents */
    if (rhs_cnt < 0)
    {
        /* single value - add it as-is */
        objptr->cons_set_element(lhs_cnt, rhs);
    }
    else
    {
        /* 
         *   clear the rest of the list, in case gc runs while retrieving
         *   elements from the rhs 
         */
        objptr->cons_clear(lhs_cnt, lhs_cnt + alo_cnt - 1);

        /* add each element from the right-hand side */
        for (int i = 1 ; i <= rhs_cnt ; ++i)
        {
            /* retrieve this element of the rhs */
            vm_val_t val;
            rhs->ll_index(vmg_ &val, i);
                
            /* store the element in the new list */
            objptr->cons_set_element(lhs_cnt + i - 1, &val);
        }
    }

    /* set the result to the new list */
    result->set_obj(obj);

    /* discard the GC protection items */
    G_stk->discard(2);
}